

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O3

void amrex::MultiFab::LinComb
               (MultiFab *dst,Real a,MultiFab *x,int xcomp,Real b,MultiFab *y,int ycomp,int dstcomp,
               int numcomp,IntVect *nghost)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  Array4<double> dfab;
  Array4<const_double> yfab;
  Array4<const_double> xfab;
  MFIter mfi;
  Box local_1d8;
  int local_1bc;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  FabArray<amrex::FArrayBox> *local_188;
  Real local_180;
  FabArray<amrex::FArrayBox> *local_178;
  Real local_170;
  FabArray<amrex::FArrayBox> *local_168;
  ulong local_160;
  ulong local_158;
  Array4<double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  local_188 = &dst->super_FabArray<amrex::FArrayBox>;
  local_180 = a;
  local_178 = &x->super_FabArray<amrex::FArrayBox>;
  local_170 = b;
  local_168 = &y->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&local_90,(FabArrayBase *)dst,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_198 = (long)ycomp << 3;
    local_190 = (long)xcomp << 3;
    local_1a0 = (long)dstcomp << 3;
    do {
      MFIter::growntilebox(&local_1d8,&local_90,nghost);
      if ((((local_1d8.smallend.vect[0] <= local_1d8.bigend.vect[0]) &&
           (local_1d8.smallend.vect[1] <= local_1d8.bigend.vect[1])) &&
          (local_1d8.smallend.vect[2] <= local_1d8.bigend.vect[2])) && (local_1d8.btype.itype < 8))
      {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d0,local_178,&local_90);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_110,local_168,&local_90);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_150,local_188,&local_90);
        if (0 < numcomp) {
          local_1bc = local_1d8.smallend.vect[2];
          local_158 = (ulong)(uint)local_1d8.bigend.vect[1];
          lVar5 = (long)local_1d8.smallend.vect[1];
          lVar6 = (long)local_1d8.smallend.vect[0] * 8;
          local_1a8 = local_1a0;
          local_1b0 = local_190;
          local_1b8 = local_198;
          uVar1 = 0;
          do {
            local_160 = uVar1;
            iVar4 = local_1d8.smallend.vect[2];
            if (local_1d8.smallend.vect[2] <= local_1d8.bigend.vect[2]) {
              do {
                if (local_1d8.smallend.vect[1] <= local_1d8.bigend.vect[1]) {
                  lVar8 = (long)iVar4;
                  lVar2 = (long)local_110.p +
                          local_110.nstride * local_1b8 +
                          (lVar8 - local_110.begin.z) * local_110.kstride * 8 +
                          (lVar5 - local_110.begin.y) * local_110.jstride * 8 +
                          (long)local_110.begin.x * -8 + lVar6;
                  lVar7 = (long)local_d0.p +
                          local_d0.nstride * local_1b0 +
                          (lVar5 - local_d0.begin.y) * local_d0.jstride * 8 +
                          (lVar8 - local_d0.begin.z) * local_d0.kstride * 8 +
                          (long)local_d0.begin.x * -8 + lVar6;
                  lVar9 = (long)local_150.p +
                          local_150.nstride * local_1a8 +
                          (lVar5 - local_150.begin.y) * local_150.jstride * 8 +
                          (lVar8 - local_150.begin.z) * local_150.kstride * 8 +
                          (long)local_150.begin.x * -8 + lVar6;
                  lVar8 = lVar5;
                  do {
                    if (local_1d8.smallend.vect[0] <= local_1d8.bigend.vect[0]) {
                      lVar3 = 0;
                      do {
                        *(double *)(lVar9 + lVar3 * 8) =
                             *(double *)(lVar7 + lVar3 * 8) * local_180 +
                             *(double *)(lVar2 + lVar3 * 8) * local_170;
                        lVar3 = lVar3 + 1;
                      } while ((local_1d8.bigend.vect[0] - local_1d8.smallend.vect[0]) + 1 !=
                               (int)lVar3);
                    }
                    lVar8 = lVar8 + 1;
                    lVar2 = lVar2 + local_110.jstride * 8;
                    lVar7 = lVar7 + local_d0.jstride * 8;
                    lVar9 = lVar9 + local_150.jstride * 8;
                  } while (local_1d8.bigend.vect[1] + 1U != (int)lVar8);
                }
                bVar10 = iVar4 != local_1d8.bigend.vect[2];
                iVar4 = iVar4 + 1;
              } while (bVar10);
            }
            local_1b8 = local_1b8 + 8;
            local_1b0 = local_1b0 + 8;
            local_1a8 = local_1a8 + 8;
            uVar1 = local_160 + 1;
          } while (local_160 + 1 != (ulong)(uint)numcomp);
        }
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MultiFab::LinComb (MultiFab& dst,
                   Real a, const MultiFab& x, int xcomp,
                   Real b, const MultiFab& y, int ycomp,
                   int dstcomp, int numcomp, const IntVect& nghost)
{
    BL_ASSERT(dst.boxArray() == x.boxArray());
    BL_ASSERT(dst.distributionMap == x.distributionMap);
    BL_ASSERT(dst.boxArray() == y.boxArray());
    BL_ASSERT(dst.distributionMap == y.distributionMap);
    BL_ASSERT(dst.nGrowVect().allGE(nghost) && x.nGrowVect().allGE(nghost) && y.nGrowVect().allGE(nghost));

    BL_PROFILE("MultiFab::LinComb()");

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstma = dst.arrays();
        auto const& xma = x.const_arrays();
        auto const& yma = y.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstma[box_no](i,j,k,dstcomp+n) = a*xma[box_no](i,j,k,xcomp+n)
                +                            b*yma[box_no](i,j,k,ycomp+n);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);

            if (bx.ok()) {
                auto const xfab =   x.array(mfi);
                auto const yfab =   y.array(mfi);
                auto       dfab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dfab(i,j,k,dstcomp+n) = a*xfab(i,j,k,xcomp+n) + b*yfab(i,j,k,ycomp+n);
                });
            }
        }
    }
}